

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSources::NoteTimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPInternalSourceData *this_00;
  bool bVar1;
  RTPInternalSourceData **ppRVar2;
  RTPTime local_50;
  RTPTime notetime;
  size_t notelen;
  RTPInternalSourceData *srcdat;
  RTPTime checktime;
  int local_28;
  int newactivecount;
  int newsendercount;
  int newtotalcount;
  RTPTime *timeoutdelay_local;
  RTPTime *curtime_local;
  RTPSources *this_local;
  
  newactivecount = 0;
  local_28 = 0;
  checktime.m_t._4_4_ = 0;
  srcdat = (RTPInternalSourceData *)curtime->m_t;
  RTPTime::operator-=((RTPTime *)&srcdat,timeoutdelay);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while (bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                 ::HasCurrentElement(&this->sourcelist), bVar1) {
    ppRVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    this_00 = *ppRVar2;
    RTPSourceData::SDES_GetNote(&this_00->super_RTPSourceData,(size_t *)&notetime);
    if (notetime.m_t != 0.0) {
      local_50 = RTPSourceData::INF_GetLastSDESNoteTime(&this_00->super_RTPSourceData);
      bVar1 = RTPTime::operator>((RTPTime *)&srcdat,&local_50);
      if (bVar1) {
        RTPInternalSourceData::ClearNote(this_00);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x12])(this,this_00);
      }
    }
    newactivecount = newactivecount + 1;
    bVar1 = RTPSourceData::IsSender(&this_00->super_RTPSourceData);
    if (bVar1) {
      local_28 = local_28 + 1;
    }
    bVar1 = RTPSourceData::IsActive(&this_00->super_RTPSourceData);
    if (bVar1) {
      checktime.m_t._4_4_ = checktime.m_t._4_4_ + 1;
    }
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::GotoNextElement(&this->sourcelist);
  }
  this->totalcount = newactivecount;
  this->sendercount = local_28;
  this->activecount = checktime.m_t._4_4_;
  return;
}

Assistant:

void RTPSources::NoteTimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		size_t notelen;

        	srcdat->SDES_GetNote(&notelen);
		if (notelen != 0) // Note has been set
		{
			RTPTime notetime = srcdat->INF_GetLastSDESNoteTime();
			
			if (checktime > notetime)
			{
				srcdat->ClearNote();
				OnNoteTimeout(srcdat);
			}
		}
		
		newtotalcount++;
		if (srcdat->IsSender())
			newsendercount++;
		if (srcdat->IsActive())
			newactivecount++;
		sourcelist.GotoNextElement();
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;

}